

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void dump_dfg_gml(EVdfg_configuration state)

{
  EVdfg_configuration in_stack_00000018;
  FILE *in_stack_00000020;
  
  fdump_dfg_gml(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

static void
dump_dfg_gml(EVdfg_configuration state)
{
    fdump_dfg_gml(stdout, state);
}